

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand.c
# Opt level: O0

CURLcode Curl_rand_bytes(Curl_easy *data,uchar *rnd,size_t num)

{
  CURLcode CVar1;
  ulong local_48;
  ulong local_40;
  size_t left;
  undefined1 local_2d;
  uint r;
  _Bool env_override;
  size_t sStack_28;
  CURLcode result;
  size_t num_local;
  uchar *rnd_local;
  Curl_easy *data_local;
  
  r = 0x2b;
  local_2d = 0;
  sStack_28 = num;
  num_local = (size_t)rnd;
  rnd_local = (uchar *)data;
  while( true ) {
    if (sStack_28 == 0) {
      return r;
    }
    if (sStack_28 < 4) {
      local_48 = sStack_28;
    }
    else {
      local_48 = 4;
    }
    local_40 = local_48;
    CVar1 = randit((Curl_easy *)rnd_local,(uint *)((long)&left + 4),false);
    if (CVar1 != CURLE_OK) break;
    for (; r = 0, local_40 != 0; local_40 = local_40 - 1) {
      *(char *)num_local = (char)left._4_4_;
      left._4_4_ = left._4_4_ >> 8;
      sStack_28 = sStack_28 - 1;
      num_local = num_local + 1;
    }
  }
  return CVar1;
}

Assistant:

CURLcode Curl_rand_bytes(struct Curl_easy *data,
#ifdef DEBUGBUILD
                         bool env_override,
#endif
                         unsigned char *rnd, size_t num)
{
  CURLcode result = CURLE_BAD_FUNCTION_ARGUMENT;
#ifndef DEBUGBUILD
  const bool env_override = FALSE;
#endif

  DEBUGASSERT(num);

  while(num) {
    unsigned int r;
    size_t left = num < sizeof(unsigned int) ? num : sizeof(unsigned int);

    result = randit(data, &r, env_override);
    if(result)
      return result;

    while(left) {
      *rnd++ = (unsigned char)(r & 0xFF);
      r >>= 8;
      --num;
      --left;
    }
  }

  return result;
}